

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptArray::GetPropertyQuery
          (JavascriptArray *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ScriptContext *this_00;
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  PropertyQueryFlags PVar4;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  uint local_34 [2];
  uint32 index;
  
  bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  if (bVar1) {
    this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  }
  else {
    this_01 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
  }
  if (this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
  }
  BVar2 = GetPropertyBuiltIns(this,propertyId,value);
  PVar4 = Property_Found;
  if (BVar2 == 0) {
    this_00 = (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    BVar2 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_34);
    if (BVar2 == 0) {
      PVar4 = DynamicObject::GetPropertyQuery
                        ((DynamicObject *)this,originalInstance,propertyId,value,info,requestContext
                        );
    }
    else {
      iVar3 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x26])(this,this,(ulong)local_34[0],value,this_00);
      PVar4 = (PropertyQueryFlags)(iVar3 == 1);
    }
  }
  return PVar4;
}

Assistant:

PropertyQueryFlags JavascriptArray::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        if (GetPropertyBuiltIns(propertyId, value))
        {
            return PropertyQueryFlags::Property_Found;
        }

        ScriptContext* scriptContext = GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(this->GetItem(this, index, value, scriptContext));
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext);
    }